

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
deqp::gls::BuiltinPrecisionTests::
MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult>::createCase
          (MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
          MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult> *this,
          Context *ctx)

{
  char *name;
  TestNode *this_00;
  
  this_00 = (TestNode *)operator_new(0x70);
  name = (ctx->name)._M_dataplus._M_p;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,ctx->testContext,name,name);
  addCase<2,2>(this,ctx,(TestCaseGroup *)this_00);
  addCase<3,2>(this,ctx,(TestCaseGroup *)this_00);
  addCase<4,2>(this,ctx,(TestCaseGroup *)this_00);
  addCase<2,3>(this,ctx,(TestCaseGroup *)this_00);
  addCase<3,3>(this,ctx,(TestCaseGroup *)this_00);
  addCase<4,3>(this,ctx,(TestCaseGroup *)this_00);
  addCase<2,4>(this,ctx,(TestCaseGroup *)this_00);
  addCase<3,4>(this,ctx,(TestCaseGroup *)this_00);
  addCase<4,4>(this,ctx,(TestCaseGroup *)this_00);
  (__return_storage_ptr__->super_UniqueBase<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>).
  m_data.ptr = this_00;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase		(const Context& ctx) const
	{
		TestCaseGroup*	const group = new TestCaseGroup(ctx.testContext,
														ctx.name.c_str(), ctx.name.c_str());

		this->addCase<2, 2>(ctx, group);
		this->addCase<3, 2>(ctx, group);
		this->addCase<4, 2>(ctx, group);
		this->addCase<2, 3>(ctx, group);
		this->addCase<3, 3>(ctx, group);
		this->addCase<4, 3>(ctx, group);
		this->addCase<2, 4>(ctx, group);
		this->addCase<3, 4>(ctx, group);
		this->addCase<4, 4>(ctx, group);

		return MovePtr<TestNode>(group);
	}